

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void Timer::SetMaxDelta(int max_delta)

{
  bool bVar1;
  Clock *this;
  pointer this_00;
  int max_delta_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&clock);
  if (bVar1) {
    this_00 = std::unique_ptr<Clock,_std::default_delete<Clock>_>::operator->(&clock);
    Clock::SetMaxDelta(this_00,max_delta);
  }
  else {
    this = (Clock *)operator_new(0x10);
    Clock::Clock(this,max_delta);
    std::unique_ptr<Clock,_std::default_delete<Clock>_>::reset(&clock,this);
  }
  return;
}

Assistant:

void Timer::SetMaxDelta(int max_delta)
{
	if (!clock)
		clock.reset(new Clock(max_delta));
	else
		clock->SetMaxDelta(max_delta);
}